

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QTzType>::QList(QList<QTzType> *this,qsizetype size)

{
  QTzType QVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  QTzType *b;
  QTzType *pQVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  QArrayData *d;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (QTzType *)QArrayData::allocate(&local_28,8,0x10,size,KeepSize);
  (this->d).d = (Data *)local_28;
  (this->d).ptr = pQVar4;
  (this->d).size = 0;
  if (size != 0) {
    pQVar4->tz_gmtoff = 0;
    auVar3 = _DAT_004da380;
    auVar2 = _DAT_004d91f0;
    pQVar4->tz_isdst = false;
    pQVar4->tz_abbrind = '\0';
    *(undefined2 *)&pQVar4->field_0x6 = 0;
    if (size != 1) {
      uVar5 = size + 0x1ffffffffffffffeU & 0x1fffffffffffffff;
      auVar7._8_4_ = (int)uVar5;
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = (int)(uVar5 >> 0x20);
      lVar6 = 0;
      auVar7 = auVar7 ^ _DAT_004d91f0;
      do {
        auVar8._8_4_ = (int)lVar6;
        auVar8._0_8_ = lVar6;
        auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar8 = (auVar8 | auVar3) ^ auVar2;
        QVar1 = *pQVar4;
        if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                    auVar7._4_4_ < auVar8._4_4_) & 1)) {
          pQVar4[lVar6 + 1] = QVar1;
        }
        if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
            auVar8._12_4_ <= auVar7._12_4_) {
          pQVar4[lVar6 + 2] = QVar1;
        }
        lVar6 = lVar6 + 2;
      } while ((uVar5 - ((uint)size & 1)) + 2 != lVar6);
    }
    (this->d).size = size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }